

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::CommitShaderResources
          (DeviceContextVkImpl *this,IShaderResourceBinding *pShaderResourceBinding,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  undefined4 uVar1;
  PIPELINE_TYPE Type;
  bool bVar2;
  Uint32 UVar3;
  DescriptorSet *pDVar4;
  VkDescriptorSet pVVar5;
  VkDescriptorSetLayout SetLayout;
  reference ppVVar6;
  Char *pCVar7;
  char (*Args_1) [114];
  char (*Args_1_00) [121];
  undefined1 local_160 [8];
  string msg_4;
  string local_138 [8];
  String _DynamicDescrSetName;
  char *DynamicDescrSetName;
  VkDescriptorSet vkDynamicDescrSet;
  VkDescriptorSetLayout vkLayout;
  string msg_3;
  string msg_2;
  string msg_1;
  DescriptorSet *CachedDescrSet;
  undefined1 local_88 [8];
  string msg;
  VkDescriptorSet_T *pVStack_60;
  Uint32 DSIndex;
  VkDescriptorSet_T *local_58;
  reference local_50;
  DescriptorSetInfo *SetInfo;
  ResourceBindInfo *BindInfo;
  PipelineResourceSignatureVkImpl *pSignature;
  ShaderResourceCacheImplType *pSStack_30;
  Uint32 SRBIndex;
  ShaderResourceCacheVk *ResourceCache;
  ShaderResourceBindingVkImpl *pResBindingVkImpl;
  IShaderResourceBinding *pIStack_18;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  IShaderResourceBinding *pShaderResourceBinding_local;
  DeviceContextVkImpl *this_local;
  
  pResBindingVkImpl._7_1_ = StateTransitionMode;
  pIStack_18 = pShaderResourceBinding;
  pShaderResourceBinding_local = (IShaderResourceBinding *)this;
  DeviceContextBase<Diligent::EngineVkImplTraits>::CommitShaderResources
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pShaderResourceBinding,
             StateTransitionMode,0);
  ResourceCache =
       (ShaderResourceCacheVk *)
       ClassPtrCast<Diligent::ShaderResourceBindingVkImpl,Diligent::IShaderResourceBinding>
                 (pIStack_18);
  pSStack_30 = ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetResourceCache
                         ((ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *)ResourceCache);
  UVar3 = ShaderResourceCacheVk::GetNumDescriptorSets(pSStack_30);
  if (UVar3 != 0) {
    ShaderResourceCacheVk::DbgVerifyDynamicBuffersCounter(pSStack_30);
    if (pResBindingVkImpl._7_1_ == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
      ShaderResourceCacheVk::TransitionResources<false>(pSStack_30,this);
    }
    else if (pResBindingVkImpl._7_1_ == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
      ShaderResourceCacheVk::TransitionResources<true>(pSStack_30,this);
    }
    pSignature._4_4_ =
         ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetBindingIndex
                   ((ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *)ResourceCache);
    BindInfo = (ResourceBindInfo *)
               ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetSignature
                         ((ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *)ResourceCache);
    Type = ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetPipelineType
                     ((ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *)ResourceCache);
    SetInfo = (DescriptorSetInfo *)GetBindInfo(this,Type);
    local_50 = std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL>::
               operator[](&((ResourceBindInfo *)SetInfo)->SetInfo,(ulong)pSignature._4_4_);
    DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::Set
              ((CommittedShaderResources *)SetInfo,pSignature._4_4_,
               (ShaderResourceBindingImplType *)ResourceCache);
    memset(&stack0xffffffffffffffa0,0,0x10);
    (local_50->vkSets)._M_elems[0] = pVStack_60;
    (local_50->vkSets)._M_elems[1] = local_58;
    msg.field_2._12_4_ = 0;
    bVar2 = PipelineResourceSignatureVkImpl::HasDescriptorSet
                      ((PipelineResourceSignatureVkImpl *)BindInfo,DESCRIPTOR_SET_ID_STATIC_MUTABLE)
    ;
    uVar1 = msg.field_2._12_4_;
    if (bVar2) {
      UVar3 = PipelineResourceSignatureVkImpl::
              GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>
                        ((PipelineResourceSignatureVkImpl *)BindInfo);
      Args_1 = (char (*) [114])(ulong)UVar3;
      if (uVar1 != UVar3) {
        FormatString<char[26],char[114]>
                  ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE>()"
                   ,Args_1);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        Args_1 = (char (*) [114])0x23d;
        DebugAssertionFailed
                  (pCVar7,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x23d);
        std::__cxx11::string::~string((string *)local_88);
      }
      pDVar4 = ShaderResourceCacheVk::GetDescriptorSet(pSStack_30,msg.field_2._12_4_);
      pVVar5 = ShaderResourceCacheVk::DescriptorSet::GetVkDescriptorSet(pDVar4);
      if (pVVar5 == (VkDescriptorSet)0x0) {
        FormatString<char[26],char[54]>
                  ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"CachedDescrSet.GetVkDescriptorSet() != VK_NULL_HANDLE",
                   (char (*) [54])Args_1);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x23f);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      pVVar5 = ShaderResourceCacheVk::DescriptorSet::GetVkDescriptorSet(pDVar4);
      ppVVar6 = std::array<VkDescriptorSet_T_*,_2UL>::operator[]
                          (&local_50->vkSets,(ulong)(uint)msg.field_2._12_4_);
      *ppVVar6 = pVVar5;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1;
    }
    bVar2 = PipelineResourceSignatureVkImpl::HasDescriptorSet
                      ((PipelineResourceSignatureVkImpl *)BindInfo,DESCRIPTOR_SET_ID_DYNAMIC);
    uVar1 = msg.field_2._12_4_;
    if (bVar2) {
      UVar3 = PipelineResourceSignatureVkImpl::
              GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)1>
                        ((PipelineResourceSignatureVkImpl *)BindInfo);
      Args_1_00 = (char (*) [121])(ulong)UVar3;
      if (uVar1 != UVar3) {
        FormatString<char[26],char[107]>
                  ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC>()"
                   ,(char (*) [107])Args_1_00);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        Args_1_00 = (char (*) [121])0x246;
        DebugAssertionFailed
                  (pCVar7,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x246);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      pDVar4 = ShaderResourceCacheVk::GetDescriptorSet(pSStack_30,msg.field_2._12_4_);
      pVVar5 = ShaderResourceCacheVk::DescriptorSet::GetVkDescriptorSet(pDVar4);
      if (pVVar5 != (VkDescriptorSet)0x0) {
        FormatString<char[26],char[121]>
                  ((string *)&vkLayout,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex).GetVkDescriptorSet() == VK_NULL_HANDLE"
                   ,Args_1_00);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x247);
        std::__cxx11::string::~string((string *)&vkLayout);
      }
      SetLayout = PipelineResourceSignatureVkImpl::GetVkDescriptorSetLayout
                            ((PipelineResourceSignatureVkImpl *)BindInfo,DESCRIPTOR_SET_ID_DYNAMIC);
      _DynamicDescrSetName.field_2._8_8_ = anon_var_dwarf_9c279;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_138,"Dynamic Descriptor Set",(allocator *)(msg_4.field_2._M_local_buf + 0xf))
      ;
      std::allocator<char>::~allocator((allocator<char> *)(msg_4.field_2._M_local_buf + 0xf));
      std::__cxx11::string::append((char *)local_138);
      DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 *)BindInfo);
      std::__cxx11::string::append((char *)local_138);
      std::__cxx11::string::operator+=(local_138,')');
      _DynamicDescrSetName.field_2._8_8_ = std::__cxx11::string::c_str();
      pVVar5 = AllocateDynamicDescriptorSet
                         (this,SetLayout,(char *)_DynamicDescrSetName.field_2._8_8_);
      PipelineResourceSignatureVkImpl::CommitDynamicResources
                ((PipelineResourceSignatureVkImpl *)BindInfo,pSStack_30,pVVar5);
      ppVVar6 = std::array<VkDescriptorSet_T_*,_2UL>::operator[]
                          (&local_50->vkSets,(ulong)(uint)msg.field_2._12_4_);
      *ppVVar6 = pVVar5;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1;
      std::__cxx11::string::~string(local_138);
    }
    uVar1 = msg.field_2._12_4_;
    UVar3 = ShaderResourceCacheVk::GetNumDescriptorSets(pSStack_30);
    if (uVar1 != UVar3) {
      FormatString<char[26],char[48]>
                ((string *)local_160,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DSIndex == ResourceCache.GetNumDescriptorSets()",
                 (char (*) [48])(ulong)UVar3);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"CommitShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x25e);
      std::__cxx11::string::~string((string *)local_160);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitShaderResources(IShaderResourceBinding* pShaderResourceBinding, RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::CommitShaderResources(pShaderResourceBinding, StateTransitionMode, 0 /*Dummy*/);

    ShaderResourceBindingVkImpl* pResBindingVkImpl = ClassPtrCast<ShaderResourceBindingVkImpl>(pShaderResourceBinding);
    ShaderResourceCacheVk&       ResourceCache     = pResBindingVkImpl->GetResourceCache();
    if (ResourceCache.GetNumDescriptorSets() == 0)
    {
        // Ignore SRBs that contain no resources
        return;
    }

#ifdef DILIGENT_DEBUG
    ResourceCache.DbgVerifyDynamicBuffersCounter();
#endif

    if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        ResourceCache.TransitionResources<false>(this);
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        ResourceCache.TransitionResources<true>(this);
    }
#endif

    const Uint32                           SRBIndex   = pResBindingVkImpl->GetBindingIndex();
    const PipelineResourceSignatureVkImpl* pSignature = pResBindingVkImpl->GetSignature();
    ResourceBindInfo&                      BindInfo   = GetBindInfo(pResBindingVkImpl->GetPipelineType());
    ResourceBindInfo::DescriptorSetInfo&   SetInfo    = BindInfo.SetInfo[SRBIndex];

    BindInfo.Set(SRBIndex, pResBindingVkImpl);
    // We must not clear entire ResInfo as DescriptorSetBaseInd and DynamicOffsetCount
    // are set by SetPipelineState().
    SetInfo.vkSets = {};

    Uint32 DSIndex = 0;
    if (pSignature->HasDescriptorSet(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE))
    {
        VERIFY_EXPR(DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE>());
        const ShaderResourceCacheVk::DescriptorSet& CachedDescrSet = const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex);
        VERIFY_EXPR(CachedDescrSet.GetVkDescriptorSet() != VK_NULL_HANDLE);
        SetInfo.vkSets[DSIndex] = CachedDescrSet.GetVkDescriptorSet();
        ++DSIndex;
    }

    if (pSignature->HasDescriptorSet(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC))
    {
        VERIFY_EXPR(DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC>());
        VERIFY_EXPR(const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex).GetVkDescriptorSet() == VK_NULL_HANDLE);

        const VkDescriptorSetLayout vkLayout = pSignature->GetVkDescriptorSetLayout(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC);

        VkDescriptorSet vkDynamicDescrSet   = VK_NULL_HANDLE;
        const char*     DynamicDescrSetName = "Dynamic Descriptor Set";
#ifdef DILIGENT_DEVELOPMENT
        String _DynamicDescrSetName{DynamicDescrSetName};
        _DynamicDescrSetName.append(" (");
        _DynamicDescrSetName.append(pSignature->GetDesc().Name);
        _DynamicDescrSetName += ')';
        DynamicDescrSetName = _DynamicDescrSetName.c_str();
#endif
        // Allocate vulkan descriptor set for dynamic resources
        vkDynamicDescrSet = AllocateDynamicDescriptorSet(vkLayout, DynamicDescrSetName);

        // Write all dynamic resource descriptors
        pSignature->CommitDynamicResources(ResourceCache, vkDynamicDescrSet);

        SetInfo.vkSets[DSIndex] = vkDynamicDescrSet;
        ++DSIndex;
    }

    VERIFY_EXPR(DSIndex == ResourceCache.GetNumDescriptorSets());
}